

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall ObjectTest_basic_get_list_Test::TestBody(ObjectTest_basic_get_list_Test *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  pointer *__ptr_11;
  _List_node_base *p_Var3;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  object obj;
  AssertHelper local_b0 [8];
  _List_base<jessilib::object,_std::allocator<jessilib::object>_> local_a8;
  char local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  _List_node_base local_78;
  _List_node_base local_68;
  _Variadic_union<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  local_58;
  undefined1 local_28;
  
  local_58._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
  local_28 = 0;
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<bool,_std::allocator<bool>_>,_std::__cxx11::list<bool,_std::allocator<bool>_>,_nullptr>
            ((list<bool,_std::allocator<bool>_> *)&local_78,(object *)&local_58._M_first,
             (list<bool,_std::allocator<bool>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var2->_M_next)->_M_impl)._M_node.
             super__List_node_base._M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<bool>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe4,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_std::__cxx11::list<signed_char,_std::allocator<signed_char>_>,_nullptr>
            ((list<signed_char,_std::allocator<signed_char>_> *)&local_78,
             (object *)&local_58._M_first,
             (list<signed_char,_std::allocator<signed_char>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<signed char>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe5,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_nullptr>
            ((list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
             (object *)&local_58._M_first,
             (list<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<unsigned char>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe6,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<short,_std::allocator<short>_>,_std::__cxx11::list<short,_std::allocator<short>_>,_nullptr>
            ((list<short,_std::allocator<short>_> *)&local_78,(object *)&local_58._M_first,
             (list<short,_std::allocator<short>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<short>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe7,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<int,_std::allocator<int>_>,_std::__cxx11::list<int,_std::allocator<int>_>,_nullptr>
            ((list<int,_std::allocator<int>_> *)&local_78,(object *)&local_58._M_first,
             (list<int,_std::allocator<int>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<int>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe8,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            ((list<long,_std::allocator<long>_> *)&local_78,(object *)&local_58._M_first,
             (list<long,_std::allocator<long>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<long>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xe9,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<long_long,_std::allocator<long_long>_>,_std::__cxx11::list<long_long,_std::allocator<long_long>_>,_nullptr>
            ((list<long_long,_std::allocator<long_long>_> *)&local_78,(object *)&local_58._M_first,
             (list<long_long,_std::allocator<long_long>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<long long>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xea,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_nullptr>
            ((list<long,_std::allocator<long>_> *)&local_78,(object *)&local_58._M_first,
             (list<long,_std::allocator<long>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<intmax_t>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xeb,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<float,_std::allocator<float>_>,_std::__cxx11::list<float,_std::allocator<float>_>,_nullptr>
            ((list<float,_std::allocator<float>_> *)&local_78,(object *)&local_58._M_first,
             (list<float,_std::allocator<float>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<float>>().empty()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xec,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<double,_std::allocator<double>_>,_std::__cxx11::list<double,_std::allocator<double>_>,_nullptr>
            ((list<double,_std::allocator<double>_> *)&local_78,(object *)&local_58._M_first,
             (list<double,_std::allocator<double>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x18);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<double>>().empty()","false")
    ;
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xed,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<long_double,_std::allocator<long_double>_>,_std::__cxx11::list<long_double,_std::allocator<long_double>_>,_nullptr>
            ((list<long_double,_std::allocator<long_double>_> *)&local_78,
             (object *)&local_58._M_first,
             (list<long_double,_std::allocator<long_double>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  p_Var3 = local_78._M_next;
  p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
  if (!(bool)local_88[0]) {
    do {
      p_Var1 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(p_Var3,0x20);
      p_Var3 = p_Var1;
      p_Var2 = local_a8._M_impl._M_node.super__List_node_base._M_next;
    } while (p_Var1 != &local_78);
  }
  while (p_Var2 != (_List_node_base *)&local_a8) {
    p_Var3 = p_Var2->_M_next;
    operator_delete(p_Var2,0x20);
    p_Var2 = p_Var3;
  }
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<long double>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xee,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_std::__cxx11::list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>,_nullptr>
            ((list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_78,(object *)&local_58._M_first,
             (list<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_78);
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::allocator<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>_>
              *)&local_a8);
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<std::u8string>>().empty()",
               "false");
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xef,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  local_a8._M_impl._M_node._M_size = 0;
  local_a8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_a8;
  local_a8._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_a8;
  jessilib::object::
  get<std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_std::__cxx11::list<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
            ((list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_78,
             (object *)&local_58._M_first,
             (list<jessilib::object,_std::allocator<jessilib::object>_> *)&local_a8);
  local_88[0] = local_78._M_next == &local_78;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::__cxx11::_List_base<jessilib::object,_std::allocator<jessilib::object>_>::_M_clear
            ((_List_base<jessilib::object,_std::allocator<jessilib::object>_> *)&local_78);
  std::__cxx11::_List_base<jessilib::object,_std::allocator<jessilib::object>_>::_M_clear(&local_a8)
  ;
  if (local_88[0] == '\0') {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&local_78,local_88,"obj.get<std::list<object>>().empty()","false")
    ;
    testing::internal::AssertHelper::AssertHelper
              (local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/object.cpp"
               ,0xf0,(char *)local_78._M_next);
    testing::internal::AssertHelper::operator=(local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(local_b0);
    if (local_78._M_next != &local_68) {
      operator_delete(local_78._M_next,(ulong)((long)&(local_68._M_next)->_M_next + 1));
    }
    if (local_a8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)((((_List_impl *)&(local_a8._M_impl._M_node.super__List_node_base._M_next)->_M_next)
                 ->_M_node).super__List_node_base._M_next)->_M_prev)();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  std::__detail::__variant::
  _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                       *)&local_58._M_first);
  return;
}

Assistant:

TEST(ObjectTest, basic_get_list) {
	object obj;

	EXPECT_TRUE(obj.get<std::list<bool>>().empty());
	EXPECT_TRUE(obj.get<std::list<signed char>>().empty());
	EXPECT_TRUE(obj.get<std::list<unsigned char>>().empty());
	EXPECT_TRUE(obj.get<std::list<short>>().empty());
	EXPECT_TRUE(obj.get<std::list<int>>().empty());
	EXPECT_TRUE(obj.get<std::list<long>>().empty());
	EXPECT_TRUE(obj.get<std::list<long long>>().empty());
	EXPECT_TRUE(obj.get<std::list<intmax_t>>().empty());
	EXPECT_TRUE(obj.get<std::list<float>>().empty());
	EXPECT_TRUE(obj.get<std::list<double>>().empty());
	EXPECT_TRUE(obj.get<std::list<long double>>().empty());
	EXPECT_TRUE(obj.get<std::list<std::u8string>>().empty());
	EXPECT_TRUE(obj.get<std::list<object>>().empty());
}